

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_endo_split
               (secp256k1_scalar *s1,secp256k1_scalar *s2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  int iVar1;
  secp256k1_scalar *in_RSI;
  secp256k1_scalar *in_RDI;
  secp256k1_scalar *unaff_retaddr;
  secp256k1_scalar tmp;
  secp256k1_ge *in_stack_ffffffffffffffb8;
  secp256k1_ge *r;
  secp256k1_scalar *a;
  secp256k1_scalar *r_00;
  
  r = (secp256k1_ge *)in_RDI->d[0];
  a = (secp256k1_scalar *)in_RDI->d[1];
  r_00 = (secp256k1_scalar *)in_RDI->d[2];
  secp256k1_scalar_split_lambda(unaff_retaddr,in_RDI,in_RSI);
  secp256k1_ge_mul_lambda(r,in_stack_ffffffffffffffb8);
  iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)r);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(r_00,a);
    secp256k1_ge_neg(r,in_stack_ffffffffffffffb8);
  }
  iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)r);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(r_00,a);
    secp256k1_ge_neg(r,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_endo_split(secp256k1_scalar *s1, secp256k1_scalar *s2, secp256k1_ge *p1, secp256k1_ge *p2) {
    secp256k1_scalar tmp = *s1;
    secp256k1_scalar_split_lambda(s1, s2, &tmp);
    secp256k1_ge_mul_lambda(p2, p1);

    if (secp256k1_scalar_is_high(s1)) {
        secp256k1_scalar_negate(s1, s1);
        secp256k1_ge_neg(p1, p1);
    }
    if (secp256k1_scalar_is_high(s2)) {
        secp256k1_scalar_negate(s2, s2);
        secp256k1_ge_neg(p2, p2);
    }
}